

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O1

int match1vs1(int matches,long limit,string *command1,string *command2)

{
  element_type *peVar1;
  int *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  mapped_type *pmVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Result_base *p_Var6;
  long lVar7;
  undefined8 *puVar8;
  int i;
  int iVar9;
  long lVar10;
  int iVar11;
  _State_baseV2 *__tmp;
  long lVar12;
  missile *pmVar13;
  missile (*pamVar14) [2];
  robot *prVar15;
  future<void> *this;
  bool bVar16;
  bool bVar17;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  int wins [4];
  int ties [4];
  Forth forth2;
  Forth forth1;
  __state_type local_10e8;
  _func_int **local_10d0 [2];
  long *local_10c0;
  long *local_10b8;
  __basic_future<void> local_10b0;
  int local_109c;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_1098;
  string *local_1078;
  string *local_1070;
  undefined8 local_1068;
  ulong local_1058;
  long local_1050;
  undefined8 local_1048 [3];
  Forth *local_1030 [256];
  Forth local_830;
  
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  r_debug = 0;
  local_1068 = 0;
  local_1048[0] = 0;
  if (0 < matches) {
    local_1058 = 1;
    local_109c = matches;
    local_1078 = command2;
    local_1070 = command1;
    local_1050 = limit;
    do {
      cppforth::Forth::Forth(&local_830);
      InitForthRobot(&local_830,step);
      local_1030[0] = &local_830;
      pmVar4 = std::
               map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
               ::operator[](&Forth2Int,(key_type *)local_1030);
      *pmVar4 = 0;
      cppforth::Forth::Forth((Forth *)local_1030);
      InitForthRobot((Forth *)local_1030,step);
      local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1030;
      pmVar4 = std::
               map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
               ::operator[](&Forth2Int,(key_type *)&local_1098);
      *pmVar4 = 1;
      local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (future<void> *)0x0;
      local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (future<void> *)0x0;
      local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157660;
      peVar1 = (element_type *)(p_Var5 + 1);
      p_Var5[2]._M_use_count = 0;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001576b0;
      p_Var6 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var6 = 0;
      *(undefined8 *)(p_Var6 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var6);
      *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(Forth **)&p_Var5[4]._M_use_count = &local_830;
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)local_1070;
      local_10d0[0] = (_func_int **)0x0;
      local_10c0 = (long *)operator_new(0x20);
      *local_10c0 = (long)&PTR___State_00157708;
      local_10c0[1] = (long)peVar1;
      local_10c0[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:445:15)>_>,_void>
                 ::_M_run;
      local_10c0[3] = 0;
      std::thread::_M_start_thread(local_10d0,&local_10c0,0);
      if (local_10c0 != (long *)0x0) {
        (**(code **)(*local_10c0 + 8))();
      }
      _Var3._M_pi = local_10e8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_0010f930:
        std::terminate();
      }
      p_Var5[3]._vptr__Sp_counted_base = local_10d0[0];
      bVar16 = local_10e8.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if (bVar16) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if (local_10e8.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157748;
        p_Var5[2]._M_use_count = 0;
        p_Var5[1]._M_use_count = 0;
        p_Var5[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
        p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00157798;
        p_Var6 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var6 = 0;
        *(undefined8 *)(p_Var6 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var6);
        _Var3._M_pi = local_10e8.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
        p_Var5[3]._vptr__Sp_counted_base = (_func_int **)p_Var6;
        *(Forth **)&p_Var5[3]._M_use_count = &local_830;
        p_Var5[4]._vptr__Sp_counted_base = (_func_int **)local_1070;
        bVar16 = local_10e8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(p_Var5 + 1);
        local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var5;
        if (bVar16) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        }
      }
      std::__basic_future<void>::__basic_future(&local_10b0,&local_10e8);
      if (local_10e8.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_10e8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_1098,
                 (future<void> *)&local_10b0);
      if (local_10b0._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_10b0._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001577e0;
      peVar1 = (element_type *)(p_Var5 + 1);
      p_Var5[2]._M_use_count = 0;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00157830;
      p_Var6 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var6 = 0;
      *(undefined8 *)(p_Var6 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var6);
      *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(Forth ***)&p_Var5[4]._M_use_count = local_1030;
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)local_1078;
      local_10d0[0] = (_func_int **)0x0;
      local_10b8 = (long *)operator_new(0x20);
      *local_10b8 = (long)&PTR___State_00157888;
      local_10b8[1] = (long)peVar1;
      local_10b8[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:457:15)>_>,_void>
                 ::_M_run;
      local_10b8[3] = 0;
      std::thread::_M_start_thread(local_10d0,&local_10b8,0);
      if (local_10b8 != (long *)0x0) {
        (**(code **)(*local_10b8 + 8))();
      }
      _Var3._M_pi = local_10e8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0010f930;
      p_Var5[3]._vptr__Sp_counted_base = local_10d0[0];
      bVar16 = local_10e8.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if (bVar16) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if (local_10e8.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001578c8;
        p_Var5[2]._M_use_count = 0;
        p_Var5[1]._M_use_count = 0;
        p_Var5[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
        p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00157918;
        p_Var6 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var6 = 0;
        *(undefined8 *)(p_Var6 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var6);
        _Var3._M_pi = local_10e8.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
        p_Var5[3]._vptr__Sp_counted_base = (_func_int **)p_Var6;
        *(Forth ***)&p_Var5[3]._M_use_count = local_1030;
        p_Var5[4]._vptr__Sp_counted_base = (_func_int **)local_1078;
        bVar16 = local_10e8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(p_Var5 + 1);
        local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var5;
        if (bVar16) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        }
      }
      std::__basic_future<void>::__basic_future(&local_10b0,&local_10e8);
      if (local_10e8.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_10e8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_1098,
                 (future<void> *)&local_10b0);
      if (local_10b0._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_10b0._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      prVar15 = robots;
      lVar10 = 0;
      do {
        init_robot((int)lVar10);
        prVar15->status = 1;
        lVar10 = lVar10 + 1;
        prVar15 = prVar15 + 1;
      } while (lVar10 == 1);
      rand_pos(2);
      if (0 < limit) {
        iVar11 = 0xf;
        lVar10 = 0;
        do {
          lVar7 = 0;
          iVar9 = 0;
          do {
            if (*(int *)(robots[0].name + lVar7 + -4) == 1) {
              cur_robot = (robot *)(robots[0].name + lVar7 + -4);
              iVar9 = iVar9 + 1;
            }
            lVar7 = lVar7 + 0xb8;
          } while (lVar7 == 0xb8);
          cycle(2);
          iVar11 = iVar11 + -1;
          if (iVar11 == 0) {
            move_robots(0);
            move_miss(0);
            lVar10 = lVar10 + 0xf;
            pamVar14 = missiles;
            lVar7 = 0;
            do {
              lVar12 = 0;
              pmVar13 = *pamVar14;
              do {
                if (((missile *)&pmVar13->stat)->stat == 2) {
                  count_miss((int)lVar7,(int)lVar12);
                }
                lVar12 = lVar12 + 1;
                pmVar13 = pmVar13 + 1;
              } while (lVar12 == 1);
              pamVar14 = (missile (*) [2])((long)pamVar14 + 0x58);
              bVar16 = lVar7 == 0;
              lVar7 = lVar7 + 1;
            } while (bVar16);
            iVar11 = 0xf;
            limit = local_1050;
          }
        } while ((1 < iVar9) && (lVar10 < limit));
      }
      bVar16 = false;
      lVar10 = 0;
      while( true ) {
        do {
          lVar7 = 0;
          do {
            if (*(int *)((long)&missiles[lVar10][0].stat + lVar7) == 1) {
              bVar16 = true;
            }
            lVar7 = lVar7 + 0x2c;
          } while (lVar7 == 0x2c);
          bVar17 = lVar10 == 0;
          lVar10 = lVar10 + 1;
        } while (bVar17);
        if (!bVar16) break;
        move_robots(0);
        lVar10 = 0;
        move_miss(0);
        bVar16 = false;
      }
      lVar10 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + (uint)(*(int *)(robots[0].name + lVar10 + -4) == 1);
        lVar10 = lVar10 + 0xb8;
      } while (lVar10 == 0xb8);
      puVar8 = local_1048;
      if (iVar11 == 1) {
        puVar8 = &local_1068;
      }
      prVar15 = robots;
      lVar10 = 0;
      do {
        if (prVar15->status == 1) {
          piVar2 = (int *)((long)puVar8 + lVar10 * 4);
          *piVar2 = *piVar2 + 1;
        }
        lVar10 = lVar10 + 1;
        prVar15 = prVar15 + 1;
      } while (lVar10 == 1);
      LOCK();
      stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
      UNLOCK();
      iVar11 = 0;
      do {
        bVar16 = true;
        lVar10 = 0;
        do {
          if (*(int *)((long)robotStatus + lVar10) != 0) {
            bVar16 = false;
          }
          lVar10 = lVar10 + 4;
        } while (lVar10 == 4);
        this = local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        if (bVar16) break;
        cycle(2);
        sched_yield();
        iVar11 = iVar11 + 1;
        this = local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      } while (iVar11 != 10000);
      for (; this != local_1098.
                     super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
        std::future<void>::get(this);
      }
      LOCK();
      stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      UNLOCK();
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_1098);
      cppforth::Forth::~Forth((Forth *)local_1030);
      cppforth::Forth::~Forth(&local_830);
      iVar11 = (int)local_1058;
      local_1058 = (ulong)(iVar11 + 1);
    } while (iVar11 != local_109c);
  }
  iVar11 = 1;
  if ((int)local_1068 <= local_1068._4_4_) {
    iVar11 = -(uint)((int)local_1068 < local_1068._4_4_);
  }
  return iVar11;
}

Assistant:

int match1vs1(int matches,
	long limit,
	const std::string &command1,
	const std::string &command2	)
{
	int num_robots = 2;
	stopAll.store(0);
	int robotsleft;
	int m_count;
	int movement;
	int i, j, k;
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);

		for (i = 0; i < num_robots; i++) {
			init_robot(i);
			// robot_go should be here
			robots[i].status = ACTIVE;
		}
		rand_pos(num_robots);
		movement = MOTION_CYCLES;
		robotsleft = num_robots;
		counter = 0L;
		while (robotsleft > 1 && counter < limit) {
			robotsleft = 0;
			for (i = 0; i < num_robots; i++) {
				if (robots[i].status == ACTIVE) {
					robotsleft++;
					cur_robot = &robots[i];
				}
			}
			cycle(num_robots);

			if (--movement == 0) {
				counter += MOTION_CYCLES;
				movement = MOTION_CYCLES;
				move_robots(0);
				move_miss(0);
				for (i = 0; i < num_robots; i++) {
					for (j = 0; j < MIS_ROBOT; j++) {
						if (missiles[i][j].stat == EXPLODING) {
							count_miss(i, j);
						}
					}
				}
			}
		}

		/* allow any flying missiles to explode */
		while (1) {
			k = 0;
			for (i = 0; i < num_robots; i++) {
				for (j = 0; j < MIS_ROBOT; j++) {
					if (missiles[i][j].stat == FLYING) {
						k = 1;
					}
				}
			}
			if (k) {
				move_robots(0);
				move_miss(0);
			}
			else
				break;
		}

		k = 0;
		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				k++;
			}
		}

		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				if (k == 1)
					wins[i]++;
				else
					ties[i]++;
			}
		}
		stopAll.store(1);
		for (int i = 0; i < 10000; ++i){
			auto end = true;
			for (j = 0; j < 2; ++j){
				if (robotStatus[j] != StatusException){
					end = false;
				}
			}
			if (end)
				break;
			cycle(num_robots);
			std::this_thread::yield();
		}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	int result{};
	if (wins[0] > wins[1]) result = 1;
	else if(wins[0] < wins[1]) result = -1;
	return result; 

}